

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O3

bool Js::DynamicObject::IsAnyTypedArray(Var aValue)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  Type typeId;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00dacbd6;
    *puVar4 = 0;
LAB_00dacadb:
    this = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00dacbd6;
      *puVar4 = 0;
    }
    typeId = ((this->type).ptr)->typeId;
    if ((int)typeId < 0x58) goto LAB_00dacbc5;
    BVar3 = RecyclableObject::IsExternal(this);
    if (BVar3 != 0) goto LAB_00dacbc5;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar2) {
LAB_00dacbd6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      typeId = TypeIds_FirstNumberType;
      if ((((ulong)aValue & 0xffff000000000000) == 0x1000000000000) ||
         (typeId = TypeIds_Number, (ulong)aValue >> 0x32 != 0)) goto LAB_00dacbc5;
      goto LAB_00dacadb;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00dacbd6;
    typeId = TypeIds_FirstNumberType;
  }
  *puVar4 = 0;
LAB_00dacbc5:
  BVar3 = TypedArrayBase::Is(typeId);
  return BVar3 != 0;
}

Assistant:

bool DynamicObject::IsAnyTypedArray(const Var aValue)
    {
        return TypedArrayBase::Is(JavascriptOperators::GetTypeId(aValue));
    }